

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::GPUShaderFP64Test2::uniformTypeDetails::uniformTypeDetails
          (uniformTypeDetails *this,GLuint n_columns,GLuint n_rows)

{
  GLenum GVar1;
  _variable_type type_00;
  string local_40;
  _variable_type local_1c;
  GLuint local_18;
  _variable_type type;
  GLuint n_rows_local;
  GLuint n_columns_local;
  uniformTypeDetails *this_local;
  
  this->m_n_columns = n_columns;
  this->m_n_rows = n_rows;
  local_18 = n_rows;
  type = n_columns;
  _n_rows_local = this;
  std::__cxx11::string::string((string *)&this->m_type_name);
  local_1c = Utils::getDoubleVariableType(type,local_18);
  Utils::getVariableTypeString_abi_cxx11_(&local_40,(Utils *)(ulong)local_1c,type_00);
  std::__cxx11::string::operator=((string *)&this->m_type_name,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  GVar1 = Utils::getGLDataTypeOfVariableType(local_1c);
  this->m_type = GVar1;
  return;
}

Assistant:

GPUShaderFP64Test2::uniformTypeDetails::uniformTypeDetails(glw::GLuint n_columns, glw::GLuint n_rows)
	: m_n_columns(n_columns), m_n_rows(n_rows)
{
	Utils::_variable_type type = Utils::getDoubleVariableType(n_columns, n_rows);

	m_type_name = Utils::getVariableTypeString(type);
	m_type		= Utils::getGLDataTypeOfVariableType(type);
}